

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  float *pfVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  ImDrawVert *pIVar4;
  ImVec4 *pIVar5;
  undefined8 *puVar6;
  ImDrawIdx IVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ImDrawIdx IVar13;
  int iVar14;
  ImDrawIdx IVar15;
  ImDrawIdx IVar16;
  uint uVar17;
  ulong uVar18;
  ImDrawIdx *pIVar19;
  byte bVar20;
  long lVar21;
  ImDrawIdx IVar22;
  int iVar23;
  bool bVar24;
  undefined4 in_XMM0_Db;
  float fVar25;
  ImVec2 IVar26;
  float fVar27;
  float fVar28;
  float fVar31;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float afStack_a8 [2];
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  ImVec2 local_88 [2];
  ulong local_78;
  ulong local_70;
  undefined8 local_68;
  int local_58;
  int local_54;
  ulong local_50;
  ImDrawIdx **local_48;
  float *local_40;
  long local_38;
  
  if (1 < points_count) {
    local_78 = (ulong)(points_count - 1U);
    IVar3 = this->_Data->TexUvWhitePixel;
    uVar9 = points_count;
    if ((flags & 1U) == 0) {
      uVar9 = points_count - 1U;
    }
    local_70 = (ulong)uVar9;
    local_68 = CONCAT44(in_XMM0_Db,thickness);
    if ((this->Flags & 1U) == 0) {
      uStack_a0 = 0x128cf3;
      PrimReserve(this,uVar9 * 6,uVar9 * 4);
      if (0 < (int)local_70) {
        uVar11 = 1;
        do {
          uVar12 = uVar11;
          if ((uint)points_count == uVar11) {
            uVar12 = 0;
          }
          fVar25 = points[uVar11 - 1].x;
          fVar27 = points[uVar12].x - fVar25;
          fVar32 = points[uVar11 - 1].y;
          auVar29._4_4_ = points[uVar12].y - fVar32;
          auVar29._0_4_ = fVar27 * fVar27 + auVar29._4_4_ * auVar29._4_4_;
          auVar29._8_8_ = 0;
          if (0.0 < auVar29._0_4_) {
            auVar30 = rsqrtss(auVar29,auVar29);
            auVar29._4_4_ = auVar29._4_4_ * auVar30._0_4_;
            fVar27 = fVar27 * auVar30._0_4_;
          }
          auVar29._4_4_ = auVar29._4_4_ * (float)local_68 * 0.5;
          fVar27 = fVar27 * (float)local_68 * 0.5;
          pIVar4 = this->_VtxWritePtr;
          IVar26.y = fVar32 - fVar27;
          IVar26.x = fVar25 + auVar29._4_4_;
          pIVar4->pos = IVar26;
          pIVar4->uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = col;
          pIVar4[1].pos.x = points[uVar12].x + auVar29._4_4_;
          pIVar4[1].pos.y = points[uVar12].y - fVar27;
          pIVar4[1].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = col;
          pIVar4[2].pos.x = points[uVar12].x - auVar29._4_4_;
          pIVar4[2].pos.y = points[uVar12].y + fVar27;
          pIVar4[2].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = col;
          pIVar4[3].pos.x = points[uVar11 - 1].x - auVar29._4_4_;
          pIVar4[3].pos.y = points[uVar11 - 1].y + fVar27;
          pIVar4[3].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[3].col = col;
          this->_VtxWritePtr = pIVar4 + 4;
          uVar9 = this->_VtxCurrentIdx;
          pIVar19 = this->_IdxWritePtr;
          IVar15 = (ImDrawIdx)uVar9;
          *pIVar19 = IVar15;
          pIVar19[1] = IVar15 + 1;
          pIVar19[2] = IVar15 + 2;
          pIVar19[3] = IVar15;
          pIVar19[4] = IVar15 + 2;
          pIVar19[5] = IVar15 + 3;
          this->_IdxWritePtr = pIVar19 + 6;
          this->_VtxCurrentIdx = uVar9 + 4;
          bVar24 = uVar11 != (local_70 & 0xffffffff);
          uVar11 = uVar11 + 1;
        } while (bVar24);
      }
    }
    else {
      local_88[0].x = thickness;
      if (thickness <= 1.0) {
        local_88[0].x = 1.0;
      }
      local_54 = (int)local_88[0].x;
      auVar29._4_4_ = this->_FringeScale;
      bVar20 = auVar29._4_4_ == 1.0 & local_54 < 0x3f & (byte)this->Flags >> 1 &
               local_88[0].x - (float)local_54 <= 1e-05;
      iVar23 = 0x12;
      if (thickness <= auVar29._4_4_) {
        iVar23 = 0xc;
      }
      iVar14 = 6;
      if (bVar20 == 0) {
        iVar14 = iVar23;
      }
      local_98 = ZEXT416((uint)auVar29._4_4_);
      local_38 = CONCAT71(local_38._1_7_,bVar20);
      local_48 = (ImDrawIdx **)CONCAT44(local_48._4_4_,flags);
      if (bVar20 == 1) {
        local_58 = points_count * 2;
        iVar23 = 3;
      }
      else {
        local_58 = points_count * 3;
        if (auVar29._4_4_ < thickness) {
          local_58 = points_count * 4;
        }
        iVar23 = (uint)(auVar29._4_4_ < thickness) * 2 + 3;
      }
      uStack_a0 = 0x128f42;
      local_50 = (ulong)(uint)points_count;
      PrimReserve(this,iVar14 * uVar9,local_58);
      uVar9 = (uint)local_50;
      lVar8 = -((ulong)(iVar23 * uVar9) * 8 + 0xf & 0xfffffffffffffff0);
      puVar6 = (undefined8 *)(local_98 + lVar8);
      uVar11 = local_50 & 0xffffffff;
      iVar23 = (int)local_70;
      if (0 < iVar23) {
        uVar12 = 1;
        do {
          uVar18 = uVar12;
          if (uVar11 == uVar12) {
            uVar18 = 0;
          }
          auVar29._4_4_ = points[uVar18].x - points[uVar12 - 1].x;
          fVar27 = points[uVar18].y - points[uVar12 - 1].y;
          auVar30._0_4_ = auVar29._4_4_ * auVar29._4_4_ + fVar27 * fVar27;
          auVar30._4_4_ = fVar27;
          auVar30._8_8_ = 0;
          if (0.0 < auVar30._0_4_) {
            auVar30 = rsqrtss(auVar30,auVar30);
            auVar29._4_4_ = auVar29._4_4_ * auVar30._0_4_;
            fVar27 = fVar27 * auVar30._0_4_;
          }
          *(float *)(local_98 + uVar12 * 8 + lVar8 + -8) = fVar27;
          *(float *)(local_98 + uVar12 * 8 + lVar8 + -4) = -auVar29._4_4_;
          bVar24 = uVar12 != (local_70 & 0xffffffff);
          uVar12 = uVar12 + 1;
        } while (bVar24);
      }
      local_40 = (float *)(puVar6 + uVar11);
      if (((ulong)local_48 & 1) == 0) {
        puVar6[local_78 & 0xffffffff] = *(undefined8 *)((long)(puVar6 + uVar11) + -0x10);
      }
      pfVar1 = local_40;
      uVar10 = col & 0xffffff;
      bVar24 = (float)local_68 <= (float)local_98._0_4_;
      local_68 = uVar11;
      if ((bVar24 | (byte)local_38) == 1) {
        auVar29._4_4_ = (float)local_98._0_4_;
        if ((byte)local_38 != 0) {
          auVar29._4_4_ = local_88[0].x * 0.5 + 1.0;
        }
        if (((ulong)local_48 & 1) == 0) {
          fVar27 = (float)*puVar6 * auVar29._4_4_;
          fVar25 = (float)((ulong)*puVar6 >> 0x20) * auVar29._4_4_;
          fVar32 = (*points).x;
          fVar28 = (*points).y;
          *(ulong *)local_40 = CONCAT44(fVar25 + fVar28,fVar27 + fVar32);
          *(ulong *)(pfVar1 + 2) = CONCAT44(fVar28 - fVar25,fVar32 - fVar27);
          uVar12 = local_78 & 0xffffffff;
          fVar27 = points[uVar12].x;
          fVar25 = points[uVar12].y;
          uVar18 = (ulong)(uint)((int)local_78 * 2);
          *(ulong *)(pfVar1 + uVar18 * 2) =
               CONCAT44((float)((ulong)puVar6[uVar12] >> 0x20) * auVar29._4_4_ + fVar25,
                        (float)puVar6[uVar12] * auVar29._4_4_ + fVar27);
          *(ulong *)(pfVar1 + uVar18 * 2 + 2) =
               CONCAT44(fVar25 - (float)((ulong)puVar6[uVar12] >> 0x20) * auVar29._4_4_,
                        fVar27 - (float)puVar6[uVar12] * auVar29._4_4_);
        }
        if (0 < iVar23) {
          local_48 = &this->_IdxWritePtr;
          pIVar19 = this->_IdxWritePtr;
          uVar12 = 1;
          uVar9 = this->_VtxCurrentIdx;
          do {
            uVar18 = uVar12 & 0xffffffff;
            if (uVar11 == uVar12) {
              uVar18 = 0;
            }
            uVar17 = uVar9 + ((byte)local_38 ^ 3);
            if (uVar11 == uVar12) {
              uVar17 = this->_VtxCurrentIdx;
            }
            fVar27 = ((float)puVar6[uVar18] +
                     (float)*(undefined8 *)(local_98 + uVar12 * 8 + lVar8 + -8)) * 0.5;
            fVar25 = ((float)((ulong)puVar6[uVar18] >> 0x20) +
                     (float)((ulong)*(undefined8 *)(local_98 + uVar12 * 8 + lVar8 + -8) >> 0x20)) *
                     0.5;
            fVar32 = fVar27 * fVar27 + fVar25 * fVar25;
            if (1e-06 < fVar32) {
              fVar32 = 1.0 / fVar32;
              fVar28 = 100.0;
              if (fVar32 <= 100.0) {
                fVar28 = fVar32;
              }
              fVar27 = fVar27 * fVar28;
              fVar25 = fVar25 * fVar28;
            }
            fVar32 = points[uVar18].x;
            fVar28 = points[uVar18].y;
            pfVar1 = local_40 + (ulong)(uint)((int)uVar18 * 2) * 2;
            *pfVar1 = fVar27 * auVar29._4_4_ + fVar32;
            pfVar1[1] = fVar25 * auVar29._4_4_ + fVar28;
            pfVar1[2] = fVar32 - fVar27 * auVar29._4_4_;
            pfVar1[3] = fVar28 - fVar25 * auVar29._4_4_;
            IVar15 = (ImDrawIdx)uVar17;
            *pIVar19 = IVar15;
            IVar22 = (ImDrawIdx)uVar9;
            pIVar19[1] = IVar22;
            if ((byte)local_38 == 0) {
              pIVar19[2] = IVar22 + 2;
              pIVar19[3] = IVar22 + 2;
              pIVar19[4] = IVar15 + 2;
              pIVar19[5] = IVar15;
              pIVar19[6] = IVar15 + 1;
              pIVar19[7] = IVar22 + 1;
              pIVar19[8] = IVar22;
              pIVar19[9] = IVar22;
              pIVar19[10] = IVar15;
              pIVar19[0xb] = IVar15 + 1;
              lVar21 = 0x18;
            }
            else {
              pIVar19[2] = IVar22 + 1;
              pIVar19[3] = IVar15 + 1;
              pIVar19[4] = IVar22 + 1;
              pIVar19[5] = IVar15;
              lVar21 = 0xc;
            }
            pIVar19 = (ImDrawIdx *)((long)pIVar19 + lVar21);
            this->_IdxWritePtr = pIVar19;
            bVar24 = uVar12 != (local_70 & 0xffffffff);
            uVar12 = uVar12 + 1;
            uVar11 = local_68;
            uVar9 = uVar17;
          } while (bVar24);
        }
        if ((byte)local_38 == 0) {
          uVar12 = 1;
          if (1 < (int)local_50) {
            uVar12 = local_50 & 0xffffffff;
          }
          lVar8 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)&points->x + lVar8);
            this->_VtxWritePtr->uv = IVar3;
            pIVar4 = this->_VtxWritePtr;
            pIVar4->col = col;
            pIVar4[1].pos = *(ImVec2 *)((long)puVar6 + lVar8 * 2 + uVar11 * 8);
            this->_VtxWritePtr[1].uv = IVar3;
            pIVar4 = this->_VtxWritePtr;
            pIVar4[1].col = uVar10;
            pIVar4[2].pos = *(ImVec2 *)((long)puVar6 + lVar8 * 2 + uVar11 * 8 + 8);
            this->_VtxWritePtr[2].uv = IVar3;
            pIVar4 = this->_VtxWritePtr;
            pIVar4[2].col = uVar10;
            this->_VtxWritePtr = pIVar4 + 3;
            lVar8 = lVar8 + 8;
          } while (uVar12 * 8 != lVar8);
        }
        else {
          uVar12 = 1;
          if (1 < (int)local_50) {
            uVar12 = local_50 & 0xffffffff;
          }
          pIVar5 = this->_Data->TexUvLines;
          pIVar2 = pIVar5 + local_54;
          auVar29._4_4_ = pIVar2->x;
          fVar27 = pIVar2->y;
          pIVar5 = pIVar5 + local_54;
          fVar25 = pIVar5->z;
          fVar32 = pIVar5->w;
          lVar8 = 0;
          do {
            this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar6 + lVar8 + uVar11 * 8);
            pIVar4 = this->_VtxWritePtr;
            (pIVar4->uv).x = auVar29._4_4_;
            (pIVar4->uv).y = fVar27;
            pIVar4 = this->_VtxWritePtr;
            pIVar4->col = col;
            pIVar4[1].pos = *(ImVec2 *)((long)puVar6 + lVar8 + uVar11 * 8 + 8);
            pIVar4 = this->_VtxWritePtr;
            pIVar4[1].uv.x = fVar25;
            pIVar4[1].uv.y = fVar32;
            pIVar4 = this->_VtxWritePtr;
            pIVar4[1].col = col;
            this->_VtxWritePtr = pIVar4 + 2;
            lVar8 = lVar8 + 0x10;
          } while (uVar12 * 0x10 != lVar8);
        }
      }
      else {
        fVar27 = (local_88[0].x - (float)local_98._0_4_) * 0.5;
        auVar29._4_4_ = (float)local_98._0_4_ + fVar27;
        if (((ulong)local_48 & 1) == 0) {
          fVar25 = (float)*puVar6;
          fVar28 = auVar29._4_4_ * fVar25;
          fVar32 = (float)((ulong)*puVar6 >> 0x20);
          fVar31 = auVar29._4_4_ * fVar32;
          fVar33 = (*points).x;
          fVar34 = (*points).y;
          fVar25 = fVar25 * fVar27;
          fVar32 = fVar32 * fVar27;
          *local_40 = fVar28 + fVar33;
          pfVar1[1] = fVar31 + fVar34;
          pfVar1[2] = fVar25 + fVar33;
          pfVar1[3] = fVar32 + fVar34;
          pfVar1[4] = fVar33 - fVar25;
          pfVar1[5] = fVar34 - fVar32;
          pfVar1[6] = fVar33 - fVar28;
          pfVar1[7] = fVar34 - fVar31;
          uVar12 = local_78 & 0xffffffff;
          fVar25 = points[uVar12].x;
          fVar32 = points[uVar12].y;
          uVar18 = (ulong)(uint)((int)local_78 << 2);
          *(ulong *)(pfVar1 + uVar18 * 2) =
               CONCAT44((float)((ulong)puVar6[uVar12] >> 0x20) * auVar29._4_4_ + fVar32,
                        (float)puVar6[uVar12] * auVar29._4_4_ + fVar25);
          *(ulong *)(pfVar1 + uVar18 * 2 + 2) =
               CONCAT44((float)((ulong)puVar6[uVar12] >> 0x20) * fVar27 + fVar32,
                        (float)puVar6[uVar12] * fVar27 + fVar25);
          *(ulong *)(pfVar1 + uVar18 * 2 + 4) =
               CONCAT44(fVar32 - (float)((ulong)puVar6[uVar12] >> 0x20) * fVar27,
                        fVar25 - (float)puVar6[uVar12] * fVar27);
          *(ulong *)(pfVar1 + uVar18 * 2 + 6) =
               CONCAT44(fVar32 - (float)((ulong)puVar6[uVar12] >> 0x20) * auVar29._4_4_,
                        fVar25 - (float)puVar6[uVar12] * auVar29._4_4_);
        }
        if (0 < iVar23) {
          pIVar19 = this->_IdxWritePtr;
          local_38 = -(local_70 & 0xffffffff);
          uVar11 = 1;
          uVar9 = this->_VtxCurrentIdx;
          do {
            uVar12 = uVar11 & 0xffffffff;
            if (local_68 == uVar11) {
              uVar12 = 0;
            }
            uVar17 = uVar9 + 4;
            if (local_68 == uVar11) {
              uVar17 = this->_VtxCurrentIdx;
            }
            fVar25 = ((float)puVar6[uVar12] +
                     (float)*(undefined8 *)(local_98 + uVar11 * 8 + lVar8 + -8)) * 0.5;
            fVar32 = ((float)((ulong)puVar6[uVar12] >> 0x20) +
                     (float)((ulong)*(undefined8 *)(local_98 + uVar11 * 8 + lVar8 + -8) >> 0x20)) *
                     0.5;
            fVar28 = fVar25 * fVar25 + fVar32 * fVar32;
            if (1e-06 < fVar28) {
              fVar28 = 1.0 / fVar28;
              fVar31 = 100.0;
              if (fVar28 <= 100.0) {
                fVar31 = fVar28;
              }
              fVar25 = fVar25 * fVar31;
              fVar32 = fVar32 * fVar31;
            }
            uVar18 = (ulong)(uint)((int)uVar12 * 4);
            fVar28 = points[uVar12].x;
            fVar31 = points[uVar12].y;
            pfVar1 = local_40 + uVar18 * 2;
            *pfVar1 = fVar25 * auVar29._4_4_ + fVar28;
            pfVar1[1] = fVar32 * auVar29._4_4_ + fVar31;
            pfVar1[2] = fVar25 * fVar27 + fVar28;
            pfVar1[3] = fVar32 * fVar27 + fVar31;
            pfVar1 = local_40 + uVar18 * 2 + 4;
            *pfVar1 = fVar28 - fVar25 * fVar27;
            pfVar1[1] = fVar31 - fVar32 * fVar27;
            pfVar1[2] = fVar28 - fVar25 * auVar29._4_4_;
            pfVar1[3] = fVar31 - fVar32 * auVar29._4_4_;
            IVar15 = (ImDrawIdx)uVar17;
            IVar16 = IVar15 + 1;
            *pIVar19 = IVar16;
            IVar22 = (ImDrawIdx)uVar9;
            pIVar19[1] = IVar22 + 1;
            IVar13 = IVar22 + 2;
            pIVar19[2] = IVar13;
            pIVar19[3] = IVar13;
            IVar7 = IVar15 + 2;
            pIVar19[4] = IVar7;
            pIVar19[5] = IVar16;
            pIVar19[6] = IVar16;
            pIVar19[7] = IVar22 + 1;
            pIVar19[8] = IVar22;
            pIVar19[9] = IVar22;
            pIVar19[10] = IVar15;
            pIVar19[0xb] = IVar16;
            pIVar19[0xc] = IVar7;
            pIVar19[0xd] = IVar13;
            pIVar19[0xe] = IVar22 + 3;
            pIVar19[0xf] = IVar22 + 3;
            pIVar19[0x10] = IVar15 + 3;
            pIVar19[0x11] = IVar7;
            pIVar19 = pIVar19 + 0x12;
            bVar24 = uVar11 != (local_70 & 0xffffffff);
            uVar11 = uVar11 + 1;
            uVar9 = uVar17;
          } while (bVar24);
          this->_IdxWritePtr = pIVar19;
          uVar11 = local_68;
          uVar9 = (uint)local_50;
        }
        uVar12 = 1;
        if (1 < (int)uVar9) {
          uVar12 = (ulong)uVar9;
        }
        lVar8 = 0;
        do {
          this->_VtxWritePtr->pos = *(ImVec2 *)((long)puVar6 + lVar8 + uVar11 * 8);
          this->_VtxWritePtr->uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4->col = uVar10;
          pIVar4[1].pos = *(ImVec2 *)((long)puVar6 + lVar8 + uVar11 * 8 + 8);
          this->_VtxWritePtr[1].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[1].col = col;
          pIVar4[2].pos = *(ImVec2 *)((long)puVar6 + lVar8 + uVar11 * 8 + 0x10);
          this->_VtxWritePtr[2].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[2].col = col;
          pIVar4[3].pos = *(ImVec2 *)((long)puVar6 + lVar8 + uVar11 * 8 + 0x18);
          this->_VtxWritePtr[3].uv = IVar3;
          pIVar4 = this->_VtxWritePtr;
          pIVar4[3].col = uVar10;
          this->_VtxWritePtr = pIVar4 + 4;
          lVar8 = lVar8 + 0x20;
        } while (uVar12 * 0x20 != lVar8);
      }
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + (uint)(ushort)local_58;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}